

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O3

void BasicTests::testRandomKeys(char *networkSourceFile)

{
  RK_Individual *pRVar1;
  uint uVar2;
  Graph *this;
  Random_keys *this_00;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> local_58;
  string local_40;
  
  this = (Graph *)operator_new(0x88);
  Graph::Graph(this);
  Graph::addChargeLevel(this,0.5,1000,0.06);
  Graph::addChargeLevel(this,1.0,0x1a68,0.06);
  Graph::addChargeLevel(this,1.8,1000,0.06);
  std::__cxx11::string::string((string *)&local_40,networkSourceFile,(allocator *)&local_58);
  Graph::input_read(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  Graph::defineModifiables(this);
  Graph::resetEdgesMarking(this);
  Graph::markOneDirectionInEdges(this);
  RK_Individual::criaCromossomos(this);
  this_00 = (Random_keys *)operator_new(0x38);
  Random_keys::Random_keys(this_00,100,1000);
  Random_keys::geraPopAleatoria(this_00,this);
  uVar2 = Random_keys::avancaGeracoes(this_00,this);
  std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::vector
            (&local_58,&this_00->popAtual);
  if ((long)this_00->tamPop - 1U <
      (ulong)((long)local_58.super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
    pRVar1 = local_58.super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
             super__Vector_impl_data._M_start[(long)this_00->tamPop + -1];
    operator_delete(local_58.super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    printf("        %.3f  &  ",pRVar1->active_loss * 100000.0);
    Graph::minVoltage(this);
    printf("        %.3f  &   ");
    printf("        %d    &   ",(ulong)uVar2);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void BasicTests::testRandomKeys(char *networkSourceFile) {
    Graph *g = new Graph();

    g->addChargeLevel(0.50, 1000, 0.06);
    g->addChargeLevel(1.00, 6760, 0.06);
    g->addChargeLevel(1.80, 1000, 0.06);

    g->input_read(networkSourceFile);
    g->defineModifiables();
    g->resetEdgesMarking();
    g->markOneDirectionInEdges();

    RK_Individual::criaCromossomos(g);

    Random_keys *rd = new Random_keys(100, 1000);

    rd->geraPopAleatoria(g);

//    rd->geraPopAleatoriaConfInicial(g, configuracaoInicial(networkSourceFile),
//                                    g->getEdgesSizes() / 2 - (g->getVerticesSize() - 1));

    int melhorGeracao = rd->avancaGeracoes(g);

    RK_Individual *best = rd->getPopAtual().at(rd->getTamPopulacao() - 1);

    printf("        %.3f  &  ", 100 * 1000 * best->getActiveLoss());
    printf("        %.3f  &   ", g->minVoltage());
    printf("        %d    &   ", melhorGeracao);
}